

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O3

bool duckdb::ArrayToListCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  BoundCastData *pBVar2;
  unsigned_long *puVar3;
  undefined1 uVar4;
  idx_t iVar5;
  Vector *pVVar6;
  Vector *pVVar7;
  VectorBuffer *pVVar8;
  idx_t iVar9;
  idx_t *piVar10;
  ulong idx;
  
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  pBVar2 = (parameters->cast_data).ptr;
  Vector::Flatten(source,count);
  iVar5 = ArrayType::GetSize(&source->type);
  iVar9 = iVar5 * count;
  ListVector::Reserve(result,iVar9);
  ListVector::SetListSize(result,iVar9);
  pVVar6 = ArrayVector::GetEntry(source);
  pVVar7 = ListVector::GetEntry(result);
  uVar4 = (*(code *)pBVar2[1]._vptr_BoundCastData)(pVVar6,pVVar7,iVar9);
  VVar1 = result->vector_type;
  pVVar6 = result;
  while (VVar1 == DICTIONARY_VECTOR) {
    DictionaryVector::VerifyDictionary(pVVar6);
    pVVar8 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pVVar6->auxiliary);
    pVVar6 = (Vector *)(pVVar8 + 1);
    VVar1 = *(VectorType *)&pVVar8[1]._vptr_VectorBuffer;
  }
  if (count != 0) {
    piVar10 = (idx_t *)(pVVar6->data + 8);
    iVar9 = 0;
    idx = 0;
    do {
      puVar3 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[idx >> 6] >> (idx & 0x3f) & 1) != 0)) {
        piVar10[-1] = iVar9;
        *piVar10 = iVar5;
      }
      else {
        FlatVector::SetNull(result,idx,true);
      }
      idx = idx + 1;
      piVar10 = piVar10 + 2;
      iVar9 = iVar9 + iVar5;
    } while (count != idx);
    if (count == 1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  return (bool)uVar4;
}

Assistant:

static bool ArrayToListCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<ArrayBoundCastData>();

	// FIXME: dont flatten
	source.Flatten(count);

	auto array_size = ArrayType::GetSize(source.GetType());
	auto child_count = count * array_size;

	ListVector::Reserve(result, child_count);
	ListVector::SetListSize(result, child_count);

	auto &source_child = ArrayVector::GetEntry(source);
	auto &result_child = ListVector::GetEntry(result);

	CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
	bool all_ok = cast_data.child_cast_info.function(source_child, result_child, child_count, child_parameters);

	auto list_data = ListVector::GetData(result);
	for (idx_t i = 0; i < count; i++) {
		if (FlatVector::IsNull(source, i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		list_data[i].offset = i * array_size;
		list_data[i].length = array_size;
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	return all_ok;
}